

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tx.c
# Opt level: O3

_Bool tx_roundtrip(char *tx_hex)

{
  wally_tx_input *txhash;
  wally_tx_output *pwVar1;
  int iVar2;
  long lVar3;
  wally_tx *tx;
  wally_tx_output *new_out;
  wally_tx_input *new_in;
  char *new_hex;
  wally_tx *local_30;
  wally_tx_output *local_28;
  wally_tx_input *local_20;
  char *local_18;
  
  iVar2 = wally_tx_from_hex(tx_hex,1,&local_30);
  if ((((iVar2 == 0) && (iVar2 = wally_tx_to_hex(local_30,1,&local_18), iVar2 == 0)) &&
      (iVar2 = strcmp(tx_hex,local_18), iVar2 == 0)) &&
     (iVar2 = wally_free_string(local_18), iVar2 == 0)) {
    txhash = local_30->inputs;
    iVar2 = wally_tx_input_init_alloc
                      (txhash->txhash,0x20,txhash->index,txhash->sequence,txhash->script,
                       txhash->script_len,txhash->witness,&local_20);
    if (iVar2 == 0) {
      lVar3 = 5;
      do {
        iVar2 = wally_tx_add_input(local_30,local_20);
        if (iVar2 != 0) {
          return false;
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
      iVar2 = wally_tx_remove_input(local_30,5);
      if (((iVar2 == 0) &&
          (iVar2 = wally_tx_add_raw_input
                             (local_30,local_20->txhash,0x20,local_20->index,local_20->sequence,
                              local_20->script,local_20->script_len,local_20->witness,0), iVar2 == 0
          )) && ((iVar2 = wally_tx_remove_input(local_30,3), iVar2 == 0 &&
                 (iVar2 = wally_tx_remove_input(local_30,2), iVar2 == 0)))) {
        iVar2 = wally_tx_remove_input(local_30,0);
        if (iVar2 != 0) {
          return false;
        }
        pwVar1 = local_30->outputs;
        iVar2 = wally_tx_output_init_alloc
                          (pwVar1->satoshi,pwVar1->script,pwVar1->script_len,&local_28);
        if (iVar2 == 0) {
          lVar3 = 5;
          do {
            iVar2 = wally_tx_add_output(local_30,local_28);
            if (iVar2 != 0) {
              return false;
            }
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          iVar2 = wally_tx_remove_output(local_30,5);
          if (iVar2 == 0) {
            iVar2 = wally_tx_add_raw_output
                              (local_30,local_28->satoshi,local_28->script,local_28->script_len,0);
            if (iVar2 != 0) {
              return false;
            }
            iVar2 = wally_tx_remove_output(local_30,3);
            if ((iVar2 == 0) && (iVar2 = wally_tx_remove_output(local_30,2), iVar2 == 0)) {
              iVar2 = wally_tx_remove_output(local_30,0);
              if (iVar2 != 0) {
                return false;
              }
              iVar2 = wally_tx_free(local_30);
              if ((iVar2 == 0) && (iVar2 = wally_tx_input_free(local_20), iVar2 == 0)) {
                iVar2 = wally_tx_output_free(local_28);
                return iVar2 == 0;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool tx_roundtrip(const char *tx_hex)
{
    struct wally_tx *tx;
    struct wally_tx_input *in, *new_in;
    struct wally_tx_output *out, *new_out;
    char *new_hex;
    size_t i;
    int ret;

    /* Unserialize and serialize the tx and verify they match */
    ret = wally_tx_from_hex(tx_hex, WALLY_TX_FLAG_USE_WITNESS, &tx);
    check_ret(ret);

    ret = wally_tx_to_hex(tx, WALLY_TX_FLAG_USE_WITNESS, &new_hex);
    if (ret != WALLY_OK || strcmp(tx_hex, new_hex))
        return false;

    ret = wally_free_string(new_hex);
    check_ret(ret);

    /* Test adding and removing inputs */
    in = &tx->inputs[0];
    ret = wally_tx_input_init_alloc(in->txhash, sizeof(in->txhash),
                                    in->index, in->sequence,
                                    in->script, in->script_len, in->witness,
                                    &new_in);
    check_ret(ret);

    for (i = 0; i < 5; ++i) {
        ret = wally_tx_add_input(tx, new_in);
        check_ret(ret);
    }
    ret = wally_tx_remove_input(tx, 5); /* Remove last */
    check_ret(ret);
    ret = wally_tx_add_raw_input(tx, new_in->txhash, WALLY_TXHASH_LEN,
                                 new_in->index, new_in->sequence,
                                 new_in->script, new_in->script_len,
                                 new_in->witness, 0);
    check_ret(ret);
    ret = wally_tx_remove_input(tx, 3); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_input(tx, 2); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_input(tx, 0); /* Remove first */
    check_ret(ret);

    /* Test adding and removing outputs */
    out = &tx->outputs[0];
    ret = wally_tx_output_init_alloc(out->satoshi,
                                     out->script, out->script_len, &new_out);
    check_ret(ret);

    for (i = 0; i < 5; ++i) {
        ret = wally_tx_add_output(tx, new_out);
        check_ret(ret);
    }

    ret = wally_tx_remove_output(tx, 5); /* Remove last */
    check_ret(ret);
    ret = wally_tx_add_raw_output(tx, new_out->satoshi, new_out->script, new_out->script_len, 0);
    check_ret(ret);
    ret = wally_tx_remove_output(tx, 3); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_output(tx, 2); /* Remove middle */
    check_ret(ret);
    ret = wally_tx_remove_output(tx, 0); /* Remove first */
    check_ret(ret);

    /* Clean up (for valgrind heap checking) */
    ret = wally_tx_free(tx);
    check_ret(ret);
    ret = wally_tx_input_free(new_in);
    check_ret(ret);
    ret = wally_tx_output_free(new_out);
    check_ret(ret);
    return true;
}